

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O1

DUMB_CLICK * dumb_click_mergesort(DUMB_CLICK *click,int n_clicks)

{
  DUMB_CLICK **ppDVar1;
  DUMB_CLICK *pDVar2;
  DUMB_CLICK *pDVar3;
  int iVar4;
  DUMB_CLICK *pDVar5;
  bool bVar6;
  DUMB_CLICK *c1;
  DUMB_CLICK *local_28;
  DUMB_CLICK *local_20;
  
  ppDVar1 = &local_28;
  local_20 = click;
  if (1 < n_clicks) {
    local_28 = click;
    iVar4 = 0;
    do {
      ppDVar1 = &(*ppDVar1)->next;
      iVar4 = iVar4 + 2;
    } while (iVar4 < n_clicks);
    pDVar3 = *ppDVar1;
    *ppDVar1 = (DUMB_CLICK *)0x0;
    pDVar2 = dumb_click_mergesort(click,n_clicks + 1U >> 1);
    local_28 = pDVar2;
    pDVar3 = dumb_click_mergesort(pDVar3,(uint)n_clicks >> 1);
    bVar6 = pDVar3 != (DUMB_CLICK *)0x0;
    if (pDVar2 == (DUMB_CLICK *)0x0 || !bVar6) {
      pDVar5 = (DUMB_CLICK *)&local_20;
    }
    else {
      pDVar5 = (DUMB_CLICK *)&local_20;
      do {
        if (pDVar3->pos < pDVar2->pos) {
          pDVar5->next = pDVar3;
          pDVar3 = pDVar3->next;
        }
        else {
          pDVar5->next = pDVar2;
          pDVar2 = pDVar2->next;
          local_28 = pDVar2;
        }
        pDVar5 = pDVar5->next;
        bVar6 = pDVar3 != (DUMB_CLICK *)0x0;
      } while ((pDVar2 != (DUMB_CLICK *)0x0) && (pDVar3 != (DUMB_CLICK *)0x0));
    }
    if (!bVar6) {
      pDVar3 = pDVar2;
    }
    pDVar5->next = pDVar3;
  }
  return local_20;
}

Assistant:

static DUMB_CLICK *dumb_click_mergesort(DUMB_CLICK *click, int n_clicks)
{
	int i;
	DUMB_CLICK *c1, *c2, **cp;

	if (n_clicks <= 1) return click;

	/* Split the list into two */
	c1 = click;
	cp = &c1;
	for (i = 0; i < n_clicks; i += 2) cp = &(*cp)->next;
	c2 = *cp;
	*cp = NULL;

	/* Sort the sublists */
	c1 = dumb_click_mergesort(c1, (n_clicks + 1) >> 1);
	c2 = dumb_click_mergesort(c2, n_clicks >> 1);

	/* Merge them */
	cp = &click;
	while (c1 && c2) {
		if (c1->pos > c2->pos) {
			*cp = c2;
			c2 = c2->next;
		} else {
			*cp = c1;
			c1 = c1->next;
		}
		cp = &(*cp)->next;
	}
	if (c2)
		*cp = c2;
	else
		*cp = c1;

	return click;
}